

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

void TTD::SnapShot::DoSnapshotCompare(SnapShot *snap1,SnapShot *snap2,TTDCompareMap *compareMap)

{
  long *plVar1;
  uint uVar2;
  TTDCompareTag TVar3;
  UnorderedArrayListLink *pUVar4;
  UnorderedArrayListLink *pUVar5;
  UnorderedArrayListLink *pUVar6;
  bool bVar7;
  uint32 uVar8;
  uint32 uVar9;
  TTDCompareTag TVar10;
  UnorderedArrayListLink *pUVar11;
  SnapContext *pSVar12;
  UnorderedArrayListLink *pUVar13;
  long *plVar14;
  int *piVar15;
  UnorderedArrayListLink **ppUVar16;
  long *plVar17;
  int *piVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  SnapRootInfoEntry *pSVar21;
  UnorderedArrayListLink **ppUVar22;
  SnapRootInfoEntry *pSVar23;
  SnapContext *snapCtx2;
  int *piVar24;
  SnapRootInfoEntry *pSVar25;
  SnapContext *pSVar26;
  int *piVar27;
  SnapContext *ctx1;
  SnapContext *snapCtx1;
  undefined8 *puVar28;
  undefined1 auStack_f8 [8];
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap1;
  undefined1 auStack_b8 [8];
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap2;
  TTDCompareTag local_6c;
  uint local_68;
  TTDCompareTag ctag;
  UnorderedArrayListLink *local_60;
  TTD_PTR_ID local_58;
  TTD_PTR_ID ptrId2;
  SnapRootInfoEntry *local_48;
  TTD_PTR_ID ptrId1;
  SlotArrayInfo *sai1;
  SlotArrayInfo *sai2;
  
  uVar8 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap1->m_rootList)
  ;
  ptrId2 = (TTD_PTR_ID)snap2;
  uVar9 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap2->m_rootList)
  ;
  TTDCompareMap::DiagnosticAssert(compareMap,uVar8 == uVar9);
  auStack_f8 = (undefined1  [8])0x0;
  allRootMap1.buckets = (Type)0x0;
  allRootMap1.entries = (Type)&Memory::HeapAllocator::Instance;
  allRootMap1.alloc = (Type)0x0;
  allRootMap1.size = 0;
  allRootMap1.count = 0;
  allRootMap1.freeList = 0x4b;
  allRootMap1.freeCount = 0;
  allRootMap1.modFunctionIndex = 0;
  auStack_b8 = (undefined1  [8])0x0;
  allRootMap2.buckets = (Type)0x0;
  allRootMap2.entries = (Type)&Memory::HeapAllocator::Instance;
  allRootMap2.alloc = (Type)0x0;
  allRootMap2.size = 0;
  allRootMap2.count = 0;
  allRootMap2.freeList = 0x4b;
  allRootMap2.freeCount = 0;
  allRootMap2.modFunctionIndex = 0;
  pSVar23 = (snap1->m_rootList).m_inlineHeadBlock.CurrPos;
  pSVar25 = (snap1->m_rootList).m_inlineHeadBlock.BlockData;
  pUVar11 = &(snap1->m_rootList).m_inlineHeadBlock;
  pSVar21 = (SnapRootInfoEntry *)0x0;
  if (pSVar25 != pSVar23) {
    pSVar21 = pSVar25;
  }
  do {
    pUVar5 = pUVar11->Next;
    do {
      do {
        pUVar11 = pUVar5;
        if (pSVar21 == (SnapRootInfoEntry *)0x0) {
          pSVar23 = *(SnapRootInfoEntry **)(ptrId2 + 0x98);
          pSVar25 = (SnapRootInfoEntry *)0x0;
          if (*(SnapRootInfoEntry **)(ptrId2 + 0xa8) != pSVar23) {
            pSVar25 = *(SnapRootInfoEntry **)(ptrId2 + 0xa8);
          }
          puVar28 = (undefined8 *)(ptrId2 + 0xb0);
          do {
            puVar19 = (undefined8 *)*puVar28;
            do {
              do {
                puVar28 = puVar19;
                if (pSVar25 == (SnapRootInfoEntry *)0x0) {
                  TTDCompareMap::DiagnosticAssert
                            (compareMap,
                             snap1->m_activeScriptContext == *(TTD_LOG_PTR_ID *)(ptrId2 + 0x90));
                  uVar8 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count
                                    (&snap1->m_ctxList);
                  uVar9 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count
                                    ((UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *)
                                     (ptrId2 + 0x40));
                  TTDCompareMap::DiagnosticAssert(compareMap,uVar8 == uVar9);
                  pSVar26 = (snap1->m_ctxList).m_inlineHeadBlock.CurrPos;
                  pSVar12 = (snap1->m_ctxList).m_inlineHeadBlock.BlockData;
                  ppUVar16 = &(snap1->m_ctxList).m_inlineHeadBlock.Next;
                  plVar1 = (long *)(ptrId2 + 0x58);
                  snapCtx1 = (SnapContext *)0x0;
                  if (pSVar12 != pSVar26) {
                    snapCtx1 = pSVar12;
                  }
LAB_00847fb2:
                  pUVar4 = *ppUVar16;
LAB_00847fb9:
                  local_60 = pUVar4;
                  if (snapCtx1 == (SnapContext *)0x0) {
                    uVar8 = UnorderedArrayList<int,_32UL>::Count
                                      (&snap1->m_tcSymbolRegistrationMapContents);
                    uVar9 = UnorderedArrayList<int,_32UL>::Count
                                      ((UnorderedArrayList<int,_32UL> *)(ptrId2 + 0x68));
                    TTDCompareMap::DiagnosticAssert(compareMap,uVar8 == uVar9);
                    piVar27 = (snap1->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos;
                    piVar15 = (snap1->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData
                    ;
                    ppUVar22 = &(snap1->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next;
                    puVar28 = (undefined8 *)(ptrId2 + 0x80);
                    piVar24 = (int *)0x0;
                    if (piVar15 != piVar27) {
                      piVar24 = piVar15;
                    }
LAB_008480ca:
                    pUVar6 = *ppUVar22;
LAB_008480d1:
                    pUVar13 = pUVar6;
                    if (piVar24 == (int *)0x0) {
                      local_6c = Done;
                      local_48 = (SnapRootInfoEntry *)0x0;
                      local_58 = 0;
                      TTDCompareMap::GetNextCompareInfo
                                (compareMap,&local_6c,(TTD_PTR_ID *)&local_48,&local_58);
                      ctag = Done;
                      local_60 = (UnorderedArrayListLink *)((ulong)local_60 & 0xffffffff00000000);
                      local_68 = 0;
                      do {
                        switch(local_6c) {
                        case Done:
                          TVar10 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::
                                   Count(&snap1->m_slotArrayEntries);
                          TVar3 = ctag;
                          uVar2 = local_68;
                          if (TVar10 < ctag) {
                            bVar7 = false;
                          }
                          else {
                            TVar10 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::
                                     Count((UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>
                                            *)(ptrId2 + 0x1b8));
                            bVar7 = TVar3 <= TVar10;
                          }
                          TTDCompareMap::DiagnosticAssert(compareMap,bVar7);
                          uVar8 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>
                                  ::Count(&snap1->m_scopeEntries);
                          if (uVar8 < (uint)local_60) {
                            bVar7 = false;
                          }
                          else {
                            uVar8 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>
                                    ::Count((UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>
                                             *)(ptrId2 + 400));
                            bVar7 = (uint)local_60 <= uVar8;
                          }
                          TTDCompareMap::DiagnosticAssert(compareMap,bVar7);
                          uVar8 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                            (&snap1->m_compoundObjectList);
                          if (uVar8 < uVar2) {
                            bVar7 = false;
                          }
                          else {
                            uVar8 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::
                                    Count((UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>
                                           *)(ptrId2 + 0x160));
                            bVar7 = uVar2 <= uVar8;
                          }
                          TTDCompareMap::DiagnosticAssert(compareMap,bVar7);
                          uVar8 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::
                                  Count(&snap1->m_slotArrayEntries);
                          uVar9 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::
                                  Count((UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>
                                         *)(ptrId2 + 0x1b8));
                          TTDCompareMap::DiagnosticAssert(compareMap,uVar8 == uVar9);
                          uVar8 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>
                                  ::Count(&snap1->m_scopeEntries);
                          uVar9 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>
                                  ::Count((UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>
                                           *)(ptrId2 + 400));
                          TTDCompareMap::DiagnosticAssert(compareMap,uVar8 == uVar9);
                          uVar8 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                            (&snap1->m_compoundObjectList);
                          uVar9 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                                            ((UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>
                                              *)(ptrId2 + 0x160));
                          TTDCompareMap::DiagnosticAssert(compareMap,uVar8 == uVar9);
                          JsUtil::
                          BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                             *)auStack_b8);
                          JsUtil::
                          BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                             *)auStack_f8);
                          return;
                        case SlotArray:
                          ptrId1 = 0;
                          sai1 = (SlotArrayInfo *)0x0;
                          TTDCompareMap::GetCompareValues
                                    (compareMap,SlotArray,(TTD_PTR_ID)local_48,
                                     (SlotArrayInfo **)&ptrId1,local_58,&sai1);
                          NSSnapValues::AssertSnapEquiv((SlotArrayInfo *)ptrId1,sai1,compareMap);
                          ctag = ctag + SlotArray;
                          break;
                        case FunctionScopeInfo:
                          ptrId1 = 0;
                          sai1 = (SlotArrayInfo *)0x0;
                          TTDCompareMap::GetCompareValues
                                    (compareMap,FunctionScopeInfo,(TTD_PTR_ID)local_48,
                                     (ScriptFunctionScopeInfo **)&ptrId1,local_58,
                                     (ScriptFunctionScopeInfo **)&sai1);
                          NSSnapValues::AssertSnapEquiv
                                    ((ScriptFunctionScopeInfo *)ptrId1,
                                     (ScriptFunctionScopeInfo *)sai1,compareMap);
                          local_60 = (UnorderedArrayListLink *)
                                     CONCAT44(local_60._4_4_,(uint)local_60 + 1);
                          break;
                        case TopLevelLoadFunction:
                          ptrId1 = 0;
                          sai1 = (SlotArrayInfo *)0x0;
                          TTDCompareMap::GetCompareValues
                                    (compareMap,TopLevelLoadFunction,(TTD_PTR_ID)local_48,&ptrId1,
                                     local_58,(uint64 *)&sai1);
                          TTDCompareMap::DiagnosticAssert
                                    (compareMap,(SlotArrayInfo *)ptrId1 == sai1);
                          break;
                        case TopLevelNewFunction:
                          ptrId1 = 0;
                          sai1 = (SlotArrayInfo *)0x0;
                          TTDCompareMap::GetCompareValues
                                    (compareMap,TopLevelNewFunction,(TTD_PTR_ID)local_48,&ptrId1,
                                     local_58,(uint64 *)&sai1);
                          TTDCompareMap::DiagnosticAssert
                                    (compareMap,(SlotArrayInfo *)ptrId1 == sai1);
                          break;
                        case TopLevelEvalFunction:
                          ptrId1 = 0;
                          sai1 = (SlotArrayInfo *)0x0;
                          TTDCompareMap::GetCompareValues
                                    (compareMap,TopLevelEvalFunction,(TTD_PTR_ID)local_48,&ptrId1,
                                     local_58,(uint64 *)&sai1);
                          TTDCompareMap::DiagnosticAssert
                                    (compareMap,(SlotArrayInfo *)ptrId1 == sai1);
                          break;
                        case FunctionBody:
                          ptrId1 = 0;
                          sai1 = (SlotArrayInfo *)0x0;
                          TTDCompareMap::GetCompareValues
                                    (compareMap,FunctionBody,(TTD_PTR_ID)local_48,
                                     (FunctionBodyResolveInfo **)&ptrId1,local_58,
                                     (FunctionBodyResolveInfo **)&sai1);
                          NSSnapValues::AssertSnapEquiv
                                    ((FunctionBodyResolveInfo *)ptrId1,
                                     (FunctionBodyResolveInfo *)sai1,compareMap);
                          break;
                        case SnapObject:
                          ptrId1 = 0;
                          sai1 = (SlotArrayInfo *)0x0;
                          TTDCompareMap::GetCompareValues
                                    (compareMap,SnapObject,(TTD_PTR_ID)local_48,
                                     (SnapObject **)&ptrId1,local_58,(SnapObject **)&sai1);
                          NSSnapObjects::AssertSnapEquiv
                                    ((SnapObject *)ptrId1,(SnapObject *)sai1,compareMap);
                          local_68 = local_68 + 1;
                          break;
                        default:
                          TTDAbort_unrecoverable_error("Missing tag in case list!!!");
                        }
                        TTDCompareMap::GetNextCompareInfo
                                  (compareMap,&local_6c,(TTD_PTR_ID *)&local_48,&local_58);
                      } while( true );
                    }
                    piVar15 = *(int **)(ptrId2 + 0x68);
                    piVar18 = (int *)0x0;
                    puVar19 = puVar28;
                    if (*(int **)(ptrId2 + 0x78) != piVar15) {
                      piVar18 = *(int **)(ptrId2 + 0x78);
                    }
                    do {
                      puVar19 = (undefined8 *)*puVar19;
                      do {
                        do {
                          puVar20 = puVar19;
                          if ((piVar18 == (int *)0x0) || (*piVar18 == *piVar24)) {
                            TTDCompareMap::DiagnosticAssert(compareMap,piVar18 != (int *)0x0);
                            piVar24 = piVar24 + 1;
                            pUVar6 = pUVar13;
                            if (piVar24 != piVar27) goto LAB_008480d1;
                            piVar24 = (int *)0x0;
                            pUVar6 = (UnorderedArrayListLink *)0x0;
                            if (pUVar13 == (UnorderedArrayListLink *)0x0) goto LAB_008480d1;
                            piVar27 = pUVar13->CurrPos;
                            piVar24 = pUVar13->BlockData;
                            ppUVar22 = &pUVar13->Next;
                            goto LAB_008480ca;
                          }
                          piVar18 = piVar18 + 1;
                          puVar19 = puVar20;
                        } while (piVar18 != piVar15);
                        piVar18 = (int *)0x0;
                        puVar19 = (undefined8 *)0x0;
                      } while (puVar20 == (undefined8 *)0x0);
                      piVar15 = (int *)*puVar20;
                      piVar18 = (int *)puVar20[2];
                      puVar19 = puVar20 + 3;
                    } while( true );
                  }
                  pSVar12 = *(SnapContext **)(ptrId2 + 0x40);
                  plVar14 = plVar1;
                  snapCtx2 = (SnapContext *)0x0;
                  if (*(SnapContext **)(ptrId2 + 0x50) != pSVar12) {
                    snapCtx2 = *(SnapContext **)(ptrId2 + 0x50);
                  }
                  do {
                    plVar14 = (long *)*plVar14;
                    do {
                      do {
                        plVar17 = plVar14;
                        if ((snapCtx2 == (SnapContext *)0x0) ||
                           (snapCtx1->ScriptContextLogId == snapCtx2->ScriptContextLogId)) {
                          TTDCompareMap::DiagnosticAssert(compareMap,snapCtx2 != (SnapContext *)0x0)
                          ;
                          NSSnapValues::AssertSnapEquiv
                                    (snapCtx1,snapCtx2,
                                     (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                      *)auStack_f8,
                                     (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                      *)auStack_b8,compareMap);
                          snapCtx1 = snapCtx1 + 1;
                          pUVar4 = local_60;
                          if (snapCtx1 != pSVar26) goto LAB_00847fb9;
                          snapCtx1 = (SnapContext *)0x0;
                          pUVar4 = (UnorderedArrayListLink *)0x0;
                          if (local_60 == (UnorderedArrayListLink *)0x0) goto LAB_00847fb9;
                          pSVar26 = local_60->CurrPos;
                          snapCtx1 = local_60->BlockData;
                          ppUVar16 = &local_60->Next;
                          goto LAB_00847fb2;
                        }
                        snapCtx2 = snapCtx2 + 1;
                        plVar14 = plVar17;
                      } while (snapCtx2 != pSVar12);
                      snapCtx2 = (SnapContext *)0x0;
                      plVar14 = (long *)0x0;
                    } while (plVar17 == (long *)0x0);
                    pSVar12 = (SnapContext *)*plVar17;
                    plVar14 = plVar17 + 3;
                    snapCtx2 = (SnapContext *)plVar17[2];
                  } while( true );
                }
                local_48 = pSVar25;
                JsUtil::
                BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::
                Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                          ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)auStack_b8,&pSVar25->LogId,&local_48);
                pSVar21 = JsUtil::
                          BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                  *)auStack_f8,&local_48->LogId);
                TTDCompareMap::DiagnosticAssert
                          (compareMap,pSVar21->MaybeLongLivedRoot == local_48->MaybeLongLivedRoot);
                pSVar21 = JsUtil::
                          BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                  *)auStack_f8,&local_48->LogId);
                TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Root
                          (compareMap,pSVar21->LogObject,local_48->LogObject,local_48->LogId);
                pSVar25 = pSVar25 + 1;
                puVar19 = puVar28;
              } while (pSVar25 != pSVar23);
              pSVar25 = (SnapRootInfoEntry *)0x0;
              puVar19 = (undefined8 *)0x0;
            } while (puVar28 == (undefined8 *)0x0);
            pSVar23 = (SnapRootInfoEntry *)*puVar28;
            pSVar25 = (SnapRootInfoEntry *)puVar28[2];
            puVar28 = puVar28 + 3;
          } while( true );
        }
        local_48 = pSVar21;
        JsUtil::
        BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                  ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)auStack_f8,&pSVar21->LogId,&local_48);
        pSVar21 = pSVar21 + 1;
        pUVar5 = pUVar11;
      } while (pSVar21 != pSVar23);
      pSVar21 = (SnapRootInfoEntry *)0x0;
      pUVar5 = (UnorderedArrayListLink *)0x0;
    } while (pUVar11 == (UnorderedArrayListLink *)0x0);
    pSVar23 = pUVar11->CurrPos;
    pSVar21 = pUVar11->BlockData;
  } while( true );
}

Assistant:

void SnapShot::DoSnapshotCompare(const SnapShot* snap1, const SnapShot* snap2, TTDCompareMap& compareMap)
    {
        //compare the roots to kick things off
        compareMap.DiagnosticAssert(snap1->m_rootList.Count() == snap2->m_rootList.Count());

        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap1(&HeapAllocator::Instance);
        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap2(&HeapAllocator::Instance);

        for(auto iter1 = snap1->m_rootList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry1 = iter1.Current();
            allRootMap1.AddNew(rootEntry1->LogId, rootEntry1);
        }

        for(auto iter2 = snap2->m_rootList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry2 = iter2.Current();
            allRootMap2.AddNew(rootEntry2->LogId, rootEntry2);

            bool ll1 = allRootMap1.Item(rootEntry2->LogId)->MaybeLongLivedRoot;
            compareMap.DiagnosticAssert(ll1 == rootEntry2->MaybeLongLivedRoot);

            TTD_PTR_ID id1 = allRootMap1.Item(rootEntry2->LogId)->LogObject;
            compareMap.CheckConsistentAndAddPtrIdMapping_Root(id1, rootEntry2->LogObject, rootEntry2->LogId);
        }

        //Get the script contexts into the mix
        compareMap.DiagnosticAssert(snap1->m_activeScriptContext == snap2->m_activeScriptContext);
        compareMap.DiagnosticAssert(snap1->m_ctxList.Count() == snap2->m_ctxList.Count());
        for(auto iter1 = snap1->m_ctxList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx1 = iter1.Current();
            const NSSnapValues::SnapContext* ctx2 = nullptr;
            for(auto iter2 = snap2->m_ctxList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(ctx1->ScriptContextLogId == iter2.Current()->ScriptContextLogId)
                {
                    ctx2 = iter2.Current();
                    break;
                }
            }
            compareMap.DiagnosticAssert(ctx2 != nullptr);

            NSSnapValues::AssertSnapEquiv(ctx1, ctx2, allRootMap1, allRootMap2, compareMap);
        }

        //compare the contents of the two thread context symbol maps
        compareMap.DiagnosticAssert(snap1->m_tcSymbolRegistrationMapContents.Count() == snap2->m_tcSymbolRegistrationMapContents.Count());
        for(auto iter1 = snap1->m_tcSymbolRegistrationMapContents.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const Js::PropertyId pid1 = *iter1.Current();
            bool match = false;
            for(auto iter2 = snap2->m_tcSymbolRegistrationMapContents.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(*iter2.Current() == pid1)
                {
                    match = true;
                    break;
                }
            }
            compareMap.DiagnosticAssert(match);
        }

        //Iterate on the worklist until we are done
        TTDCompareTag ctag = TTDCompareTag::Done;
        TTD_PTR_ID ptrId1 = TTD_INVALID_PTR_ID;
        TTD_PTR_ID ptrId2 = TTD_INVALID_PTR_ID;

        uint32 comparedSlotArrays = 0;
        uint32 comparedScopes = 0;
        uint32 comparedObjects = 0;

        compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        while(ctag != TTDCompareTag::Done)
        {
            if(ctag == TTDCompareTag::SlotArray)
            {
                const NSSnapValues::SlotArrayInfo* sai1 = nullptr;
                const NSSnapValues::SlotArrayInfo* sai2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &sai1, ptrId2, &sai2);
                NSSnapValues::AssertSnapEquiv(sai1, sai2, compareMap);

                comparedSlotArrays++;
            }
            else if(ctag == TTDCompareTag::FunctionScopeInfo)
            {
                const NSSnapValues::ScriptFunctionScopeInfo* scope1 = nullptr;
                const NSSnapValues::ScriptFunctionScopeInfo* scope2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &scope1, ptrId2, &scope2);
                NSSnapValues::AssertSnapEquiv(scope1, scope2, compareMap);

                comparedScopes++;
            }
            else if(ctag == TTDCompareTag::TopLevelLoadFunction)
            {
                uint64 fload1 = 0;
                uint64 fload2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fload1, ptrId2, &fload2);
                compareMap.DiagnosticAssert(fload1 == fload2);
            }
            else if(ctag == TTDCompareTag::TopLevelNewFunction)
            {
                uint64 fnew1 = 0;
                uint64 fnew2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fnew1, ptrId2, &fnew2);
                compareMap.DiagnosticAssert(fnew1 == fnew2);
            }
            else if(ctag == TTDCompareTag::TopLevelEvalFunction)
            {
                uint64 feval1 = 0;
                uint64 feval2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &feval1, ptrId2, &feval2);
                compareMap.DiagnosticAssert(feval1 == feval2);
            }
            else if(ctag == TTDCompareTag::FunctionBody)
            {
                const NSSnapValues::FunctionBodyResolveInfo* fb1 = nullptr;
                const NSSnapValues::FunctionBodyResolveInfo* fb2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &fb1, ptrId2, &fb2);
                NSSnapValues::AssertSnapEquiv(fb1, fb2, compareMap);
            }
            else if(ctag == TTDCompareTag::SnapObject)
            {
                const NSSnapObjects::SnapObject* obj1 = nullptr;
                const NSSnapObjects::SnapObject* obj2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &obj1, ptrId2, &obj2);
                NSSnapObjects::AssertSnapEquiv(obj1, obj2, compareMap);

                comparedObjects++;
            }
            else
            {
                TTDAssert(false, "Missing tag in case list!!!");
            }

            compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        }

        //Make sure all objects/values have been matched -- well not quite since we don't align and treaverse WeakSet values we might not compare everything -- maybe improve later?
        compareMap.DiagnosticAssert(comparedSlotArrays <= snap1->m_slotArrayEntries.Count() && comparedSlotArrays <= snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(comparedScopes <= snap1->m_scopeEntries.Count() && comparedScopes <= snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(comparedObjects <= snap1->m_compoundObjectList.Count() && comparedObjects <= snap2->m_compoundObjectList.Count());

        compareMap.DiagnosticAssert(snap1->m_slotArrayEntries.Count() == snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_scopeEntries.Count() == snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_compoundObjectList.Count() == snap2->m_compoundObjectList.Count());

        //
        //TODO: if we missed something we may want to put code here to identify it
        //
    }